

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

Continue __thiscall
cmCoreTryCompile::Arguments::SetSourceType(Arguments *this,string_view sourceType)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  ulong uVar2;
  string local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_t local_78;
  char *local_70;
  Arguments *local_68;
  char *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  char *local_40;
  Arguments *local_38;
  char *local_30;
  byte local_21;
  Arguments *pAStack_20;
  bool matched;
  Arguments *this_local;
  string_view sourceType_local;
  
  local_30 = sourceType._M_str;
  local_38 = (Arguments *)sourceType._M_len;
  local_21 = 0;
  pAStack_20 = this;
  this_local = local_38;
  sourceType_local._M_len = (size_t)local_30;
  local_58 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("NORMAL",6);
  local_48 = local_58._M_len;
  local_40 = local_58._M_str;
  __x_00._M_str = local_30;
  __x_00._M_len = (size_t)local_38;
  bVar1 = std::operator==(__x_00,local_58);
  if (bVar1) {
    this->SourceTypeContext = Normal;
    local_21 = 1;
  }
  else {
    local_68 = this_local;
    local_60 = (char *)sourceType_local._M_len;
    local_88 = (basic_string_view<char,_std::char_traits<char>_>)
               ::cm::operator____s("CXX_MODULE",10);
    local_78 = local_88._M_len;
    local_70 = local_88._M_str;
    __x._M_str = local_60;
    __x._M_len = (size_t)local_68;
    bVar1 = std::operator==(__x,local_88);
    if (bVar1) {
      this->SourceTypeContext = CxxModule;
      local_21 = 1;
    }
  }
  if (((local_21 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
    cmStrCat<char_const(&)[24],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[43]>
              (&local_a8,(char (*) [24])"Invalid \'SOURCE_TYPE\' \'",
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               (char (*) [43])"\'; must be one of \'SOURCE\' or \'CXX_MODULE\'");
    std::__cxx11::string::operator=((string *)&this->SourceTypeError,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return Yes;
}

Assistant:

ArgumentParser::Continue cmCoreTryCompile::Arguments::SetSourceType(
  cm::string_view sourceType)
{
  bool matched = false;
  if (sourceType == "NORMAL"_s) {
    this->SourceTypeContext = SourceType::Normal;
    matched = true;
  } else if (sourceType == "CXX_MODULE"_s) {
    this->SourceTypeContext = SourceType::CxxModule;
    matched = true;
  }

  if (!matched && this->SourceTypeError.empty()) {
    // Only remember one error at a time; all other errors related to argument
    // parsing are "indicate one error and return" anyways.
    this->SourceTypeError =
      cmStrCat("Invalid 'SOURCE_TYPE' '", sourceType,
               "'; must be one of 'SOURCE' or 'CXX_MODULE'");
  }
  return ArgumentParser::Continue::Yes;
}